

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O1

void If_LibBoxAdd(If_LibBox_t *p,If_Box_t *pBox)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  long lVar4;
  size_t __size;
  int iVar5;
  int iVar6;
  
  pVVar2 = p->vBoxes;
  if (pBox->Id < pVVar2->nSize) goto LAB_00429a35;
  lVar4 = (long)pBox->Id * 2 + 10;
  iVar5 = (int)lVar4;
  if (iVar5 <= pVVar2->nSize) goto LAB_00429a35;
  iVar1 = pVVar2->nCap;
  iVar6 = iVar1 * 2;
  if (iVar6 < iVar5) {
    if (iVar1 < iVar5) {
      __size = lVar4 * 8;
      if (pVVar2->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(pVVar2->pArray,__size);
      }
      pVVar2->pArray = ppvVar3;
      iVar6 = iVar5;
LAB_00429a0e:
      pVVar2->nCap = iVar6;
    }
  }
  else if (iVar1 < iVar6 && iVar1 < iVar5) {
    if (pVVar2->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((long)iVar1 << 4);
    }
    else {
      ppvVar3 = (void **)realloc(pVVar2->pArray,(long)iVar1 << 4);
    }
    pVVar2->pArray = ppvVar3;
    goto LAB_00429a0e;
  }
  lVar4 = (long)pVVar2->nSize;
  if (pVVar2->nSize < iVar5) {
    do {
      pVVar2->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar5 != lVar4);
  }
  pVVar2->nSize = iVar5;
LAB_00429a35:
  lVar4 = (long)pBox->Id;
  if ((-1 < lVar4) && (pBox->Id < p->vBoxes->nSize)) {
    ppvVar3 = p->vBoxes->pArray;
    if (ppvVar3[lVar4] == (void *)0x0) {
      ppvVar3[lVar4] = pBox;
      p->nBoxes = p->nBoxes + 1;
      return;
    }
    __assert_fail("Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifLibBox.c"
                  ,0x8c,"void If_LibBoxAdd(If_LibBox_t *, If_Box_t *)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void If_LibBoxAdd( If_LibBox_t * p, If_Box_t * pBox )
{
    if ( pBox->Id >= Vec_PtrSize(p->vBoxes) )
        Vec_PtrFillExtra( p->vBoxes, 2 * pBox->Id + 10, NULL );
    assert( Vec_PtrEntry( p->vBoxes, pBox->Id ) == NULL );
    Vec_PtrWriteEntry( p->vBoxes, pBox->Id, pBox );
    p->nBoxes++;
}